

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

_Bool patch_reloc(tcg_insn_unit *code_ptr,int type,intptr_t value,intptr_t addend)

{
  ushort uVar1;
  uint uVar2;
  undefined1 extraout_AL;
  undefined1 uVar3;
  long lVar4;
  tcg_insn_unit tVar5;
  int iVar6;
  long lVar7;
  ulong extraout_RDX;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar21 [16];
  int iVar31;
  undefined1 auVar25 [16];
  int iVar32;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  uVar9 = (ulong)(uint)type;
  lVar7 = value + addend;
  if (type != 1) {
    if (type == 0x17) {
      tVar5 = (tcg_insn_unit)(lVar7 - (long)code_ptr);
      if ((long)(char)tVar5 == lVar7 - (long)code_ptr) {
        *code_ptr = tVar5;
        return true;
      }
      return false;
    }
    if (type != 2) {
      patch_reloc_cold_1();
      auVar29 = _DAT_00d58680;
      iVar6 = (int)extraout_RDX;
      uVar3 = extraout_AL;
      if (0 < iVar6) {
        lVar4 = (long)(int)uVar9;
        lVar7 = (extraout_RDX & 0xffffffff) - 1;
        auVar14._8_4_ = (int)lVar7;
        auVar14._0_8_ = lVar7;
        auVar14._12_4_ = (int)((ulong)lVar7 >> 0x20);
        lVar7 = *(long *)(code_ptr + 0x18) + lVar4 * 4;
        lVar12 = 0;
        auVar14 = auVar14 ^ _DAT_00d58680;
        auVar27 = _DAT_00d58660;
        auVar35 = _DAT_00d58670;
        do {
          auVar25 = auVar35 ^ auVar29;
          iVar31 = auVar14._4_4_;
          iVar32 = auVar14._12_4_;
          iVar8 = (int)uVar9;
          if ((bool)(~(auVar25._4_4_ == iVar31 && auVar14._0_4_ < auVar25._0_4_ ||
                      iVar31 < auVar25._4_4_) & 1)) {
            *(int *)(lVar7 + lVar12) = iVar8;
          }
          if ((auVar25._12_4_ != iVar32 || auVar25._8_4_ <= auVar14._8_4_) &&
              auVar25._12_4_ <= iVar32) {
            *(int *)(lVar7 + 4 + lVar12) = iVar8 + 1;
          }
          auVar25 = auVar27 ^ auVar29;
          auVar33._0_4_ = -(uint)(auVar14._0_4_ < auVar25._0_4_);
          auVar33._4_4_ = -(uint)(iVar31 < auVar25._4_4_);
          auVar33._8_4_ = -(uint)(auVar14._8_4_ < auVar25._8_4_);
          auVar33._12_4_ = -(uint)(iVar32 < auVar25._12_4_);
          iVar31 = -(uint)(auVar25._4_4_ == iVar31);
          iVar32 = -(uint)(auVar25._12_4_ == iVar32);
          auVar37._4_4_ = iVar31;
          auVar37._0_4_ = iVar31;
          auVar37._8_4_ = iVar32;
          auVar37._12_4_ = iVar32;
          auVar26._4_4_ = auVar33._4_4_;
          auVar26._0_4_ = auVar33._4_4_;
          auVar26._8_4_ = auVar33._12_4_;
          auVar26._12_4_ = auVar33._12_4_;
          auVar25._8_4_ = 0xffffffff;
          auVar25._0_8_ = 0xffffffffffffffff;
          auVar25._12_4_ = 0xffffffff;
          auVar25 = (auVar26 | auVar37 & auVar33) ^ auVar25;
          if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(int *)(lVar7 + 8 + lVar12) = iVar8 + 2;
          }
          if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(int *)(lVar7 + 0xc + lVar12) = iVar8 + 3;
          }
          auVar26 = _DAT_00d5a450;
          lVar15 = auVar35._8_8_;
          auVar35._0_8_ = auVar35._0_8_ + 4;
          auVar35._8_8_ = lVar15 + 4;
          lVar15 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 4;
          auVar27._8_8_ = lVar15 + 4;
          uVar9 = (ulong)(iVar8 + 4);
          lVar12 = lVar12 + 0x10;
        } while ((ulong)(iVar6 + 3U >> 2) << 4 != lVar12);
        if (iVar6 != 1) {
          lVar4 = lVar4 * 4 + *(long *)(code_ptr + 0x18);
          lVar7 = *(long *)(code_ptr + 0x10);
          uVar10 = 1;
          uVar9 = 0;
          do {
            uVar11 = uVar9 + 1;
            uVar13 = uVar10;
            do {
              iVar8 = *(int *)(lVar4 + uVar9 * 4);
              uVar1 = *(ushort *)(lVar7 + (long)iVar8 * 8);
              iVar31 = 0x20;
              iVar32 = 0x20;
              if ((-1 < (char)uVar1) && (iVar32 = 0, (uVar1 & 1) != 0)) {
                uVar2 = *(uint *)(lVar7 + 4 + (long)iVar8 * 8);
                iVar16 = 0;
                iVar17 = 0;
                iVar18 = 0;
                iVar19 = 0;
                iVar32 = 0x20;
                auVar29 = auVar26;
                do {
                  auVar27 = pshuflw(auVar25,auVar29,0xfe);
                  lVar12 = auVar27._0_8_;
                  auVar34._0_4_ = uVar2 >> lVar12;
                  auVar34._4_4_ = uVar2 >> lVar12;
                  auVar34._8_4_ = uVar2 >> lVar12;
                  auVar34._12_4_ = uVar2 >> lVar12;
                  auVar27 = pshuflw(auVar27,auVar29,0x54);
                  iVar20 = auVar29._4_4_;
                  iVar22 = auVar29._8_4_;
                  iVar23 = auVar29._12_4_;
                  auVar28._0_8_ = auVar29._8_8_;
                  auVar28._8_4_ = iVar22;
                  auVar28._12_4_ = iVar23;
                  auVar35 = pshuflw(auVar34,auVar28,0xfe);
                  auVar25 = pshuflw(auVar28,auVar28,0x54);
                  iVar16 = iVar16 + (uVar2 >> auVar27._0_8_ & 1);
                  iVar17 = iVar17 + (auVar34._4_4_ & 1);
                  iVar18 = iVar18 + (uVar2 >> auVar25._0_8_ & 1);
                  iVar19 = iVar19 + (uVar2 >> auVar35._0_8_ & 1);
                  auVar29._0_4_ = auVar29._0_4_ + 4;
                  auVar29._4_4_ = iVar20 + 4;
                  auVar29._8_4_ = iVar22 + 4;
                  auVar29._12_4_ = iVar23 + 4;
                  iVar32 = iVar32 + -4;
                } while (iVar32 != 0);
                iVar32 = 0x21 - (iVar19 + iVar17 + iVar18 + iVar16);
              }
              iVar16 = *(int *)(lVar4 + uVar13 * 4);
              uVar1 = *(ushort *)(lVar7 + (long)iVar16 * 8);
              if ((-1 < (char)uVar1) && (iVar31 = 0, (uVar1 & 1) != 0)) {
                uVar2 = *(uint *)(lVar7 + 4 + (long)iVar16 * 8);
                iVar17 = 0;
                iVar18 = 0;
                iVar19 = 0;
                iVar20 = 0;
                iVar31 = 0x20;
                auVar21 = auVar26;
                do {
                  auVar29 = pshuflw(auVar25,auVar21,0xfe);
                  lVar12 = auVar29._0_8_;
                  auVar36._0_4_ = uVar2 >> lVar12;
                  auVar36._4_4_ = uVar2 >> lVar12;
                  auVar36._8_4_ = uVar2 >> lVar12;
                  auVar36._12_4_ = uVar2 >> lVar12;
                  auVar29 = pshuflw(auVar29,auVar21,0x54);
                  iVar22 = auVar21._4_4_;
                  iVar23 = auVar21._8_4_;
                  iVar24 = auVar21._12_4_;
                  auVar30._0_8_ = auVar21._8_8_;
                  auVar30._8_4_ = iVar23;
                  auVar30._12_4_ = iVar24;
                  auVar27 = pshuflw(auVar36,auVar30,0xfe);
                  auVar25 = pshuflw(auVar30,auVar30,0x54);
                  iVar17 = iVar17 + (uVar2 >> auVar29._0_8_ & 1);
                  iVar18 = iVar18 + (auVar36._4_4_ & 1);
                  iVar19 = iVar19 + (uVar2 >> auVar25._0_8_ & 1);
                  iVar20 = iVar20 + (uVar2 >> auVar27._0_8_ & 1);
                  auVar21._0_4_ = auVar21._0_4_ + 4;
                  auVar21._4_4_ = iVar22 + 4;
                  auVar21._8_4_ = iVar23 + 4;
                  auVar21._12_4_ = iVar24 + 4;
                  iVar31 = iVar31 + -4;
                } while (iVar31 != 0);
                iVar31 = 0x21 - (iVar20 + iVar18 + iVar19 + iVar17);
              }
              if (iVar32 < iVar31) {
                *(int *)(lVar4 + uVar9 * 4) = iVar16;
                *(int *)(lVar4 + uVar13 * 4) = iVar8;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != (extraout_RDX & 0xffffffff));
            uVar10 = uVar10 + 1;
            uVar9 = uVar11;
          } while (uVar11 != iVar6 - 1);
        }
        uVar3 = (undefined1)lVar4;
      }
      return (_Bool)uVar3;
    }
    lVar7 = lVar7 - (long)code_ptr;
    if ((int)lVar7 != lVar7) {
      return false;
    }
  }
  *(int *)code_ptr = (int)lVar7;
  return true;
}

Assistant:

static bool patch_reloc(tcg_insn_unit *code_ptr, int type,
                        intptr_t value, intptr_t addend)
{
    value += addend;
    switch(type) {
    case R_386_PC32:
        value -= (uintptr_t)code_ptr;
        if (value != (int32_t)value) {
            return false;
        }
        /* FALLTHRU */
    case R_386_32:
        tcg_patch32(code_ptr, value);
        break;
    case R_386_PC8:
        value -= (uintptr_t)code_ptr;
        if (value != (int8_t)value) {
            return false;
        }
        tcg_patch8(code_ptr, value);
        break;
    default:
        tcg_abort();
    }
    return true;
}